

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

Attribute * prvTidyCheckAttribute(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Attribute *pAVar1;
  uint uVar2;
  
  pAVar1 = attval->dict;
  if (pAVar1 != (Attribute *)0x0) {
    if ((pAVar1->id - TidyAttr_XML_LANG < 2) &&
       (doc->lexer->isvoyager = yes, *(int *)((doc->config).value + 0x1b) == 0)) {
      prvTidySetOptionBool(doc,TidyXhtmlOut,yes);
      prvTidySetOptionBool(doc,TidyXmlOut,yes);
    }
    uVar2 = AttributeVersions(node,attval);
    prvTidyConstrainVersion(doc,uVar2);
    if (pAVar1->attrchk != (AttrCheck *)0x0) {
      (*pAVar1->attrchk)(doc,node,attval);
    }
  }
  if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
     ((node->tag->versions & 0x61fff) != 0)) {
    uVar2 = AttributeVersions(node,attval);
    if ((uVar2 & 0x61fff) == 0) {
      prvTidyReportAttrError(doc,node,attval,0x101);
      if (*(int *)((doc->config).value + 0x23) != 0) {
        prvTidyRemoveAttribute(doc,node,attval);
      }
    }
  }
  return pAVar1;
}

Assistant:

const Attribute* TY_(CheckAttribute)( TidyDocImpl* doc, Node *node, AttVal *attval )
{
    const Attribute* attribute = attval->dict;

    if ( attribute != NULL )
    {
        if (attrIsXML_LANG(attval) || attrIsXML_SPACE(attval))
        {
            doc->lexer->isvoyager = yes;
            if (!cfgBool(doc, TidyHtmlOut))
            {
                TY_(SetOptionBool)(doc, TidyXhtmlOut, yes);
                TY_(SetOptionBool)(doc, TidyXmlOut, yes);
            }
        }

        TY_(ConstrainVersion)(doc, AttributeVersions(node, attval));
        
        if (attribute->attrchk)
            attribute->attrchk( doc, node, attval );
    }

    if (AttributeIsProprietary(node, attval))
    {
        TY_(ReportAttrError)(doc, node, attval, PROPRIETARY_ATTRIBUTE);

        if (cfgBool(doc, TidyDropPropAttrs))
            TY_(RemoveAttribute)( doc, node, attval );
    }

    return attribute;
}